

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotTesting.c
# Opt level: O0

void printInmate(Inmate *inmate)

{
  char cVar1;
  Inmate *inmate_local;
  
  cVar1 = inmate->type;
  if (cVar1 == '\0') {
    printf("unit:\t Protagonist\n");
  }
  else if (cVar1 == 'a') {
    printf("unit:\t Attorney\n");
  }
  else if (cVar1 == 'b') {
    printf("unit:\t Bruiser\n");
  }
  else if (cVar1 == 'c') {
    printf("unit:\t Cutie\n");
  }
  else if (cVar1 == 'd') {
    printf("unit:\t Doctor\n");
  }
  else if (cVar1 == 'f') {
    printf("unit:\t Fatty\n");
  }
  else if (cVar1 == 'h') {
    printf("unit:\t Homeboy\n");
  }
  else if (cVar1 == 'l') {
    printf("unit:\t Lunatic\n");
  }
  else if (cVar1 == 's') {
    printf("unit:\t Speedy\n");
  }
  printf("pos:\t%f\n",(double)inmate->position);
  printf("curHP:\t%d\n",(ulong)inmate->currentHealth);
  printf("maxHP:\t%d\n",(ulong)inmate->maxHealth);
  printf("speed:\t%d\n",(ulong)inmate->speed);
  printf("rep:\t%d\n",(ulong)inmate->rep);
  printf("panic:\t%d\n",(ulong)inmate->panic);
  printf("\n");
  return;
}

Assistant:

void printInmate(struct Inmate *inmate) {

    switch (inmate->type) {
        case PROTAGONIST:
            printf("unit:\t Protagonist\n");
            break;

        case HOMEBOY:
            printf("unit:\t Homeboy\n");
            break;

        case BRUISER:
            printf("unit:\t Bruiser\n");
            break;

        case LUNATIC:
            printf("unit:\t Lunatic\n");
            break;

        case FATTY:
            printf("unit:\t Fatty\n");
            break;

        case SPEEDY:
            printf("unit:\t Speedy\n");
            break;

        case CUTIE:
            printf("unit:\t Cutie\n");
            break;

        case ATTORNEY:
            printf("unit:\t Attorney\n");
            break;

        case DOCTOR:
            printf("unit:\t Doctor\n");
            break;

        default:
            break;
    }

    printf("pos:\t%f\n", inmate->position);
    printf("curHP:\t%d\n", inmate->currentHealth);
    printf("maxHP:\t%d\n", inmate->maxHealth);
    printf("speed:\t%d\n", inmate->speed);
    printf("rep:\t%d\n", inmate->rep);
    printf("panic:\t%d\n", inmate->panic);
    printf("\n");

    return;
}